

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

CompiledMethod *
Lodtalk::compileMethod
          (VMContext *vmContext,EvaluationScopePtr *scope,Ref<Lodtalk::ClassDescription> *clazz,
          Node *ast)

{
  int iVar1;
  ClassDescription *this;
  Oop classBinding;
  undefined4 extraout_var;
  MethodSemanticAnalysis semanticAnalyzer;
  MethodCompiler compiler;
  MethodSemanticAnalysis local_120;
  MethodCompiler local_e0;
  
  MethodSemanticAnalysis::MethodSemanticAnalysis(&local_120,vmContext,scope);
  (*ast->_vptr_Node[2])(ast,&local_120);
  this = Ref<Lodtalk::ClassDescription>::operator->(clazz);
  classBinding = Behavior::getBinding(&this->super_Behavior,vmContext);
  MethodCompiler::MethodCompiler(&local_e0,vmContext,classBinding);
  iVar1 = classIndexOf((Oop)(clazz->reference).oop.field_0);
  if ((iVar1 == 0x5d) || (iVar1 == 0x5b)) {
    MethodAssembler::Assembler::useLongInstanceVariableAccessors(&local_e0.gen);
  }
  iVar1 = (*ast->_vptr_Node[2])(ast,&local_e0);
  MethodCompiler::~MethodCompiler(&local_e0);
  MethodSemanticAnalysis::~MethodSemanticAnalysis(&local_120);
  return (CompiledMethod *)CONCAT44(extraout_var,iVar1);
}

Assistant:

CompiledMethod *compileMethod(VMContext *vmContext, const EvaluationScopePtr &scope, const Ref<ClassDescription> &clazz, Node *ast)
{
    // Perform the semantic analysis
    MethodSemanticAnalysis semanticAnalyzer(vmContext, scope);
    ast->acceptVisitor(&semanticAnalyzer);

    // Generate the actual method
	MethodCompiler compiler(vmContext, clazz->getBinding(vmContext));
    auto classIndex = classIndexOf(clazz.getOop());
    if (classIndex == SMCI_InstructionStream || classIndex == SMCI_Context)
        compiler.useLongInstanceVariableAccessors();

    return reinterpret_cast<CompiledMethod*> (ast->acceptVisitor(&compiler).pointer);
}